

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O1

int read_single_file<ENF>(ENF *pub,Pub_File *file,bool auto_split,int version,int first_id)

{
  pointer *ppuVar1;
  string *psVar2;
  pointer puVar3;
  pointer pEVar4;
  iterator __position;
  Pub_File *pPVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uchar uVar12;
  ulong uVar13;
  ulong uVar14;
  uchar namesize;
  size_t last_split;
  string name;
  string shout;
  char buf [39];
  uchar local_cb;
  byte local_ca;
  byte local_c9;
  Pub_File *local_c8;
  unsigned_long local_c0;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_b8;
  char *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  ulong local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  char local_58 [40];
  
  __stream = fopen((file->filename)._M_dataplus._M_p,"rb");
  eodata_safe_fail_filename = (file->filename)._M_dataplus._M_p;
  local_c8 = file;
  if (__stream == (FILE *)0x0) {
    Console::Err("Could not load file: %s");
  }
  else {
    local_ca = first_id == 1 && auto_split;
    local_a0 = &local_90;
    local_98 = 0;
    local_90 = 0;
    local_78 = &local_68;
    local_70 = 0;
    local_68 = 0;
    local_58[0x20] = '\0';
    local_58[0x21] = '\0';
    local_58[0x22] = '\0';
    local_58[0x23] = '\0';
    local_58[0x24] = '\0';
    local_58[0x25] = '\0';
    local_58[0x26] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = 0;
    uVar11 = 64000;
    if (first_id != 1 || !auto_split) {
      uVar11 = 900;
    }
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    if (0 < version) {
      uVar11 = 900;
    }
    local_a8 = (ulong)uVar11;
    iVar6 = fseek(__stream,10,0);
    if (iVar6 == 0) {
      sVar8 = fread(&local_cb,1,1,__stream);
      if (sVar8 == 1) {
        local_b8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_c8->splits;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,4);
        local_80 = (ulong)(uint)first_id;
        local_c9 = local_ca ^ 1;
        local_b0 = "Auto-split file is too large (%d bytes too long): %s";
        uVar14 = 0;
        do {
          iVar6 = (int)uVar14;
          if ((int)((uVar14 & 0xffffffff) / 900) * -900 + iVar6 == 0 && local_c9 == 0) {
            lVar9 = ftell(__stream);
            puVar3 = (local_c8->splits).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if ((local_c8->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start == puVar3) {
              uVar11 = 0xffffffff;
            }
            else {
              uVar11 = ~(uint)puVar3[-1];
            }
            iVar7 = (int)lVar9 + uVar11;
            if (0xf9f8 < iVar7) {
              Console::Err("Auto-split file is too large (%d bytes too long): %s",
                           (ulong)(iVar7 - 0xf9f8),(local_c8->filename)._M_dataplus._M_p);
            }
            lVar9 = ftell(__stream);
            local_c0 = lVar9 - 1;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,&local_c0);
          }
          uVar11 = PacketProcessor::Number(local_cb,0xfe,0xfe,0xfe);
          uVar12 = (uchar)uVar11;
          local_cb = uVar12;
          std::__cxx11::string::resize((ulong)&local_a0,uVar12);
          if (uVar12 != '\0') {
            sVar8 = fread(local_a0,1,(ulong)(uVar11 & 0xff),__stream);
            if (sVar8 != (uVar11 & 0xff)) {
              fclose(__stream);
              Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,
                           0xd5);
              goto LAB_001380df;
            }
          }
          sVar8 = fread(local_58,1,0x27,__stream);
          if (sVar8 != 0x27) {
            fclose(__stream);
            Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0xe0)
            ;
            goto LAB_001380df;
          }
          iVar7 = (int)local_80 + iVar6;
          uVar13 = (ulong)iVar7;
          pEVar4 = (pub->data).
                   super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          psVar2 = &pEVar4[uVar13].name;
          *(int *)((long)(psVar2 + -1) + 0x18) = iVar7;
          std::__cxx11::string::_M_assign((string *)psVar2);
          pub_read_record(pEVar4 + uVar13,local_58);
          uVar10 = ((long)(pub->data).
                          super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pub->data).
                          super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
          if (uVar10 < uVar13 || uVar10 - uVar13 == 0) {
LAB_00137f6a:
            iVar6 = iVar6 + 1;
            goto LAB_00137f6d;
          }
          sVar8 = fread(&local_cb,1,1,__stream);
          if (sVar8 != 1) goto LAB_00137f6a;
          uVar14 = uVar14 + 1;
          if (local_a8 == uVar14) {
            iVar6 = (int)local_a8;
LAB_00137f6d:
            local_c0 = ftell(__stream);
            pPVar5 = local_c8;
            puVar3 = (local_c8->splits).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar7 = (int)local_c0 - (int)puVar3[-1];
            if (0xf9f8 < iVar7) {
              if ((local_ca == 0) || ((ulong)((long)puVar3 - *(long *)local_b8) < 9)) {
                local_b0 = "File is too large (%d bytes too long): %s";
              }
              Console::Err(local_b0,(ulong)(iVar7 - 0xf9f8),(local_c8->filename)._M_dataplus._M_p);
            }
            __position._M_current =
                 (pPVar5->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pPVar5->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(local_b8,__position,&local_c0);
            }
            else {
              *__position._M_current = local_c0;
              ppuVar1 = &(pPVar5->splits).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            fclose(__stream);
            if (local_78 != &local_68) {
              operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
            }
            if (local_a0 != &local_90) {
              operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
            }
            return iVar6;
          }
        } while( true );
      }
      fclose(__stream);
      Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0xbb);
    }
    else {
      fclose(__stream);
      Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0xba);
    }
  }
LAB_001380df:
  exit(1);
}

Assistant:

int read_single_file(T& pub, Pub_File& file, bool auto_split, int version, int first_id)
{
	std::FILE *fh = std::fopen(file.filename.c_str(), "rb");
	eodata_safe_fail_filename = file.filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", file.filename.c_str());
		std::exit(1);
	}

	// Only attempt to auto-split the first file
	if (first_id != 1)
		auto_split = false;

	unsigned char namesize, shoutsize;
	std::string name, shout;
	char buf[T::DATA_SIZE] = {0};

	int readobj = 0;
	int max_entries = T::FILE_MAX_ENTRIES;

	if constexpr (std::is_same_v<T, ECF>)
	{
		if (version >= 1)
			max_entries = T::FILE_MAX_ENTRIES_V2;
	}

	if (version < 1 && auto_split == true)
		max_entries = 64000;

	SAFE_SEEK(fh, 10, SEEK_SET);
	SAFE_READ(static_cast<void *>(&namesize), sizeof(char), 1, fh);

	if constexpr (std::is_same_v<T, ESF>)
	{
		SAFE_READ(static_cast<void *>(&shoutsize), sizeof(char), 1, fh);
	}

	file.splits.reserve(4);

	for (int i = 0; i < max_entries; ++i)
	{
		if (auto_split && (i % T::FILE_MAX_ENTRIES == 0))
		{
			std::size_t split = std::size_t(std::ftell(fh)) - 1;
			int size = (int)split - (file.splits.empty() ? 0 : (int)file.splits.back());

			if (size > 63992)
				Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());

			file.splits.push_back(std::size_t(std::ftell(fh)) - 1);
		}

		namesize = PacketProcessor::Number(namesize);
		name.resize(namesize);

		if (namesize > 0)
			SAFE_READ(&name[0], sizeof(char), namesize, fh);

		if constexpr (std::is_same_v<T, ESF>)
		{
			shoutsize = PacketProcessor::Number(shoutsize);
			shout.resize(shoutsize);

			if (shoutsize > 0)
				SAFE_READ(&shout[0], sizeof(char), shoutsize, fh);
		}

		SAFE_READ(buf, sizeof(char), T::DATA_SIZE, fh);

		typename T::data_t& newdata = pub.data[first_id + i];

		++readobj;

		newdata.id = first_id + i;
		newdata.name = name;

		if constexpr (std::is_same_v<T, ESF>)
		{
			newdata.shout = shout;
		}

		pub_read_record(newdata, buf);

		if (first_id + i >= pub.data.size()
		 || std::fread(static_cast<void *>(&namesize), sizeof(char), 1, fh) != 1)
		{
			break;
		}

		if constexpr (std::is_same_v<T, ESF>)
		{
			if (std::fread(static_cast<void *>(&shoutsize), sizeof(char), 1, fh) != 1)
			{
				break;
			}
		}
	}

	std::size_t last_split = std::size_t(std::ftell(fh));
	int size = (int)last_split - (int)file.splits.back();

	if (size > 63992)
	{
		if (auto_split && file.splits.size() > 1)
			Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
		else
			Console::Err("File is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
	}

	file.splits.push_back(last_split);

	std::fclose(fh);

	return readobj;
}